

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderLang.cpp
# Opt level: O0

bool anon_unknown.dwarf_8f1b29::CompileDeferred
               (TCompiler *compiler,char **shaderStrings,int numStrings,int *inputLengths,
               char **stringNames,char *preamble,EShOptimizationLevel optLevel,
               TBuiltInResource *resources,int defaultVersion,EProfile defaultProfile,
               bool forceDefaultVersionAndProfile,int overrideVersion,bool forwardCompatible,
               EShMessages messages,TIntermediate *intermediate,Includer *includer,
               string *sourceEntryPointName,TEnvironment *environment,bool compileOnly)

{
  bool bVar1;
  string local_88;
  DoFullParse local_64;
  byte local_63;
  undefined1 local_62;
  undefined1 local_61;
  DoFullParse parser;
  bool compileOnly_local;
  bool forwardCompatible_local;
  char *pcStack_60;
  bool forceDefaultVersionAndProfile_local;
  char *preamble_local;
  char **stringNames_local;
  int *inputLengths_local;
  int numStrings_local;
  char **shaderStrings_local;
  TCompiler *compiler_local;
  
  local_61 = forceDefaultVersionAndProfile;
  local_62 = forwardCompatible;
  local_63 = compileOnly;
  pcStack_60 = preamble;
  std::__cxx11::string::string((string *)&local_88,(string *)sourceEntryPointName);
  bVar1 = ProcessDeferred<(anonymous_namespace)::DoFullParse>
                    (compiler,shaderStrings,numStrings,inputLengths,stringNames,preamble,optLevel,
                     resources,defaultVersion,defaultProfile,forceDefaultVersionAndProfile,
                     overrideVersion,forwardCompatible,messages,intermediate,&local_64,true,includer
                     ,&local_88,environment,(bool)(local_63 & 1));
  std::__cxx11::string::~string((string *)&local_88);
  return bVar1;
}

Assistant:

bool CompileDeferred(
    TCompiler* compiler,
    const char* const shaderStrings[],
    const int numStrings,
    const int* inputLengths,
    const char* const stringNames[],
    const char* preamble,
    const EShOptimizationLevel optLevel,
    const TBuiltInResource* resources,
    int defaultVersion,         // use 100 for ES environment, 110 for desktop
    EProfile defaultProfile,
    bool forceDefaultVersionAndProfile,
    int overrideVersion,        // use 0 if not overriding GLSL version
    bool forwardCompatible,     // give errors for use of deprecated features
    EShMessages messages,       // warnings/errors/AST; things to print out
    TIntermediate& intermediate,// returned tree, etc.
    TShader::Includer& includer,
    const std::string sourceEntryPointName = "",
    TEnvironment* environment = nullptr,
    bool compileOnly = false)
{
    DoFullParse parser;
    return ProcessDeferred(compiler, shaderStrings, numStrings, inputLengths, stringNames,
                           preamble, optLevel, resources, defaultVersion,
                           defaultProfile, forceDefaultVersionAndProfile, overrideVersion,
                           forwardCompatible, messages, intermediate, parser,
                           true, includer, sourceEntryPointName, environment, compileOnly);
}